

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O2

string * __thiscall
SchemaConverter::_not_strings
          (string *__return_storage_ptr__,SchemaConverter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *strings)

{
  pointer pbVar1;
  mapped_type *rule;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  pointer string;
  function<void_(const_TrieNode_&)> visit;
  TrieNode trie;
  string char_rule;
  ostringstream out;
  allocator<char> local_231;
  key_type local_230;
  TrieNode local_210;
  string local_1d8;
  anon_class_24_3_d264b97f local_1b8;
  string local_1a0 [11];
  
  local_210.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_210.children._M_t._M_impl.super__Rb_tree_header._M_header;
  local_210.children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_210.children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_210.children._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_210.is_end_of_string = false;
  pbVar1 = (strings->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_210.children._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_210.children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (string = (strings->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; string != pbVar1; string = string + 1) {
    _not_strings(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::
    TrieNode::insert(std::__cxx11::string_const__(&local_210,string);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a0,"char",(allocator<char> *)&local_1b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"char",&local_231);
  rule = std::__detail::
         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
         ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BuiltinRule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&PRIMITIVE_RULES_abi_cxx11_,&local_230);
  _add_primitive(&local_1d8,this,local_1a0,rule);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::operator<<((ostream *)local_1a0,"[\"] ( ");
  local_1b8.out = (ostringstream *)local_1a0;
  local_1b8.visit = (function<void_(const_TrieNode_&)> *)&local_230;
  local_1b8.char_rule = &local_1d8;
  std::
  function<void(SchemaConverter::_not_strings(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::TrieNode_const&)>
  ::
  function<SchemaConverter::_not_strings(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(SchemaConverter::_not_strings(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::TrieNode_const&)_1_,void>
            ((function<void(SchemaConverter::_not_strings(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::TrieNode_const&)>
              *)&local_230,&local_1b8);
  std::function<void_(const_TrieNode_&)>::operator()
            ((function<void_(const_TrieNode_&)> *)&local_230,&local_210);
  std::operator<<((ostream *)local_1a0," )");
  if (local_210.is_end_of_string == false) {
    std::operator<<((ostream *)local_1a0,"?");
  }
  std::operator<<((ostream *)local_1a0," [\"] space");
  std::__cxx11::stringbuf::str();
  std::_Function_base::~_Function_base((_Function_base *)&local_230);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::
  _Rb_tree<char,_std::pair<const_char,_TrieNode>,_std::_Select1st<std::pair<const_char,_TrieNode>_>,_std::less<char>,_std::allocator<std::pair<const_char,_TrieNode>_>_>
  ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_TrieNode>,_std::_Select1st<std::pair<const_char,_TrieNode>_>,_std::less<char>,_std::allocator<std::pair<const_char,_TrieNode>_>_>
               *)&local_210);
  return __return_storage_ptr__;
}

Assistant:

std::string _not_strings(const std::vector<std::string> & strings) {

        struct TrieNode {
            std::map<char, TrieNode> children;
            bool is_end_of_string;

            TrieNode() : is_end_of_string(false) {}

            void insert(const std::string & string) {
                auto node = this;
                for (char c : string) {
                    node = &node->children[c];
                }
                node->is_end_of_string = true;
            }
        };

        TrieNode trie;
        for (const auto & s : strings) {
            trie.insert(s);
        }

        std::string char_rule = _add_primitive("char", PRIMITIVE_RULES.at("char"));
        std::ostringstream out;
        out << "[\"] ( ";
        std::function<void(const TrieNode &)> visit = [&](const TrieNode & node) {
            std::ostringstream rejects;
            auto first = true;
            for (const auto & kv : node.children) {
                rejects << kv.first;
                if (first) {
                    first = false;
                } else {
                    out << " | ";
                }
                out << "[" << kv.first << "]";
                if (!kv.second.children.empty()) {
                    out << " (";
                    visit(kv.second);
                    out << ")";
                } else if (kv.second.is_end_of_string) {
                    out << " " << char_rule << "+";
                }
            }
            if (!node.children.empty()) {
                if (!first) {
                    out << " | ";
                }
                out << "[^\"" << rejects.str() << "] " << char_rule << "*";
            }
        };
        visit(trie);

        out << " )";
        if (!trie.is_end_of_string) {
            out << "?";
        }
        out << " [\"] space";
        return out.str();
    }